

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O1

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicCapability>
          (Orphan<capnp::DynamicValue> *this,Orphan<capnp::DynamicCapability> *other)

{
  ClientHook *pCVar1;
  Client local_70;
  Builder local_58;
  
  capnp::Orphan<capnp::DynamicCapability>::get(&local_70,other);
  local_58.type = CAPABILITY;
  local_58.field_1.anyPointerValue.builder.segment =
       (SegmentBuilder *)local_70.super_Client.hook.disposer;
  local_58.field_1.textValue.content.ptr = (char *)local_70.super_Client.hook.ptr;
  local_58.field_1.textValue.content.size_ = (size_t)local_70.schema.super_Schema.raw;
  local_70.super_Client.hook.ptr = (ClientHook *)0x0;
  Orphan(this,&local_58,&other->builder);
  DynamicValue::Builder::~Builder(&local_58);
  pCVar1 = local_70.super_Client.hook.ptr;
  if (local_70.super_Client.hook.ptr != (ClientHook *)0x0) {
    local_70.super_Client.hook.ptr = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)&(local_70.super_Client.hook.disposer)->_vptr_Disposer)->arena->
              _vptr_Arena)
              (local_70.super_Client.hook.disposer,
               (_func_int *)((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
  }
  return;
}

Assistant:

inline Orphan<DynamicValue>::Orphan(Orphan<T>&& other)
    : Orphan(other.get(), kj::mv(other.builder)) {}